

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall despot::BaseRockSample::Observe(BaseRockSample *this)

{
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_RCX;
  ACT_TYPE in_EDX;
  Belief *in_RSI;
  
  Observe((BaseRockSample *)
          &this[-1].transition_probabilities_.
           super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void BaseRockSample::Observe(const Belief* belief, ACT_TYPE action,
	map<OBS_TYPE, double>& obss) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	if (action <= E_SAMPLE) {
		RockSampleState* state = static_cast<RockSampleState*>(particles[0]);
		int id = NextState(state->state_id, action);
		if (id != NumStates() - 1)
			obss[E_NONE] = 1.0;
	} else { // Sense a rock
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			RockSampleState* state = static_cast<RockSampleState*>(particle);
			int id = NextState(state->state_id, action);
			if (id == NumStates() - 1)
				continue; // ignore terminal state
			const RockSampleState& next = *(states_[id]);

			int rock = action - E_SAMPLE - 1;
			double distance = Coord::EuclideanDistance(GetRobPos(&next),
				rock_pos_[rock]);
			double efficiency = (1
				+ pow(2, -distance / half_efficiency_distance_)) * 0.5;

			if (GetRock(&next, rock)) {
				obss[E_GOOD] += state->weight * efficiency;
				if (efficiency != 1)
					obss[E_BAD] += state->weight * (1 - efficiency);
			} else {
				obss[E_BAD] += state->weight * efficiency;
				if (efficiency != 1)
					obss[E_GOOD] += state->weight * (1 - efficiency);
			}
		}
	}
}